

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_join.cpp
# Opt level: O3

void __thiscall duckdb::HashJoinRepartitionEvent::Schedule(HashJoinRepartitionEvent *this)

{
  pointer puVar1;
  PhysicalHashJoin *op_p;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ClientContext *pCVar7;
  int iVar8;
  pointer pJVar9;
  undefined4 extraout_var;
  type this_00;
  idx_t iVar10;
  pointer this_01;
  idx_t iVar11;
  ulong uVar12;
  reference pvVar13;
  type pJVar14;
  Pipeline *this_02;
  type pJVar15;
  HashJoinRepartitionTask *this_03;
  long lVar16;
  enable_shared_from_this<duckdb::Task> *object;
  vector<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
  *this_04;
  unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true> *local_ht;
  pointer puVar17;
  HashJoinRepartitionEvent *this_05;
  idx_t thread_idx;
  ulong uVar18;
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_true> partition_tasks;
  _Head_base<0UL,_duckdb::HashJoinRepartitionTask_*,_false> local_c0;
  ClientContext *local_b8;
  HashJoinRepartitionEvent *local_b0;
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  local_a8;
  enable_shared_from_this<duckdb::Event> local_88;
  shared_ptr<duckdb::Event,_true> local_78;
  enable_shared_from_this<duckdb::Event> *local_68;
  pointer local_60;
  Task *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  local_48;
  
  pJVar9 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>::
           operator->(&this->sink->hash_table);
  iVar8 = (*pJVar9->buffer_manager->_vptr_BufferManager[0xf])();
  local_b8 = (ClientContext *)CONCAT44(extraout_var,iVar8);
  puVar17 = (this->local_hts->
            super_vector<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->local_hts->
           super_vector<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_b0 = this;
  if (puVar17 == puVar1) {
    uVar18 = 0;
    lVar16 = 0;
  }
  else {
    lVar16 = 0;
    uVar18 = 0;
    do {
      pJVar9 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>::
               operator->(puVar17);
      this_00 = unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
                ::operator*(&pJVar9->sink_collection);
      iVar10 = PartitionedTupleData::SizeInBytes(this_00);
      lVar16 = lVar16 + iVar10;
      iVar10 = PartitionedTupleData::Count(this_00);
      uVar18 = uVar18 + iVar10;
      puVar17 = puVar17 + 1;
    } while (puVar17 != puVar1);
  }
  this_05 = local_b0;
  pCVar7 = local_b8;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_b8;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = ((long)local_b8 + lVar16) - 1;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = SUB168(auVar5 / auVar2,0);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar18;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = SUB168(auVar6 / auVar3,0);
  auVar4 = (ZEXT816(0) << 0x40 | ZEXT816(0x800)) / auVar4;
  iVar8 = 2;
  if (2 < auVar4._0_8_) {
    iVar8 = auVar4._0_4_;
  }
  pJVar9 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>::
           operator->(&local_b0->sink->hash_table);
  iVar10 = pJVar9->radix_bits;
  this_01 = unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
            ::operator->(&this_05->sink->temporary_memory_state);
  iVar11 = TemporaryMemoryState::GetReservation(this_01);
  uVar12 = iVar11 / (((ulong)(uint)(iVar8 * 2) << ((char)iVar10 - 4U & 0x3f)) * (long)pCVar7);
  uVar12 = uVar12 + (uVar12 == 0);
  this_04 = &this_05->local_hts->
             super_vector<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
  ;
  uVar18 = uVar12;
  if (uVar12 < (ulong)((long)(this_04->
                             super__Vector_base<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this_04->
                             super__Vector_base<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 3)) {
    do {
      pvVar13 = vector<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_true>
                ::operator[]((vector<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_true>
                              *)this_04,uVar18 % uVar12);
      pJVar9 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>::
               operator->(pvVar13);
      pvVar13 = vector<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_true>
                ::operator[](this_05->local_hts,uVar18);
      pJVar14 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>
                ::operator*(pvVar13);
      JoinHashTable::Merge(pJVar9,pJVar14);
      uVar18 = uVar18 + 1;
      this_04 = &this_05->local_hts->
                 super_vector<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
      ;
    } while (uVar18 < (ulong)((long)(this_04->
                                    super__Vector_base<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this_04->
                                    super__Vector_base<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 3));
    ::std::
    vector<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
    ::resize(this_04,uVar12);
  }
  this_02 = shared_ptr<duckdb::Pipeline,_true>::operator->
                      (&(this_05->super_BasePipelineEvent).pipeline);
  local_b8 = Pipeline::GetClientContext(this_02);
  local_a8.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ::reserve(&local_a8,
            (long)(this_05->local_hts->
                  super_vector<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
                  ).
                  super__Vector_base<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this_05->local_hts->
                  super_vector<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
                  ).
                  super__Vector_base<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
  puVar17 = (this_05->local_hts->
            super_vector<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_60 = (this_05->local_hts->
             super_vector<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
             ).
             super__Vector_base<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar17 != local_60) {
    local_68 = &(this_05->super_BasePipelineEvent).super_Event.
                super_enable_shared_from_this<duckdb::Event>;
    do {
      enable_shared_from_this<duckdb::Event>::shared_from_this(&local_88);
      pJVar14 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>
                ::operator*(&this_05->sink->hash_table);
      pJVar15 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>
                ::operator*(puVar17);
      op_p = local_b0->op;
      this_03 = (HashJoinRepartitionTask *)operator_new(0x60);
      local_78.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_88.__weak_this_.internal.
           super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_78.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = local_88.__weak_this_.internal.
              super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      local_88.__weak_this_.internal.super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_88.__weak_this_.internal.super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      HashJoinRepartitionTask::HashJoinRepartitionTask
                (this_03,&local_78,local_b8,pJVar14,pJVar15,(PhysicalOperator *)op_p);
      this_05 = local_b0;
      local_c0._M_head_impl = this_03;
      if (local_78.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      ::std::__shared_ptr<duckdb::Task,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<duckdb::HashJoinRepartitionTask,std::default_delete<duckdb::HashJoinRepartitionTask>,void>
                ((__shared_ptr<duckdb::Task,(__gnu_cxx::_Lock_policy)2> *)&local_58,
                 (unique_ptr<duckdb::HashJoinRepartitionTask,_std::default_delete<duckdb::HashJoinRepartitionTask>_>
                  *)&local_c0);
      object = &local_58->super_enable_shared_from_this<duckdb::Task>;
      if (local_58 == (Task *)0x0) {
        object = (enable_shared_from_this<duckdb::Task> *)0x0;
      }
      shared_ptr<duckdb::Task,_true>::__enable_weak_this<duckdb::Task,_duckdb::Task,_0>
                ((shared_ptr<duckdb::Task,_true> *)&local_58,object,local_58);
      ::std::
      vector<duckdb::shared_ptr<duckdb::Task,true>,std::allocator<duckdb::shared_ptr<duckdb::Task,true>>>
      ::emplace_back<duckdb::shared_ptr<duckdb::Task,true>>
                ((vector<duckdb::shared_ptr<duckdb::Task,true>,std::allocator<duckdb::shared_ptr<duckdb::Task,true>>>
                  *)&local_a8,(shared_ptr<duckdb::Task,_true> *)&local_58);
      if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
      }
      if (local_c0._M_head_impl != (HashJoinRepartitionTask *)0x0) {
        (*((local_c0._M_head_impl)->super_ExecutorTask).super_Task._vptr_Task[1])();
      }
      local_c0._M_head_impl = (HashJoinRepartitionTask *)0x0;
      if (local_88.__weak_this_.internal.super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_88.__weak_this_.internal.
                   super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      puVar17 = puVar17 + 1;
    } while (puVar17 != local_60);
  }
  local_48.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_a8.
       super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_a8.
       super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_a8.
       super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_a8.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Event::SetTasks((Event *)this_05,(vector<duckdb::shared_ptr<duckdb::Task,_true>,_true> *)&local_48
                 );
  ::std::
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ::~vector(&local_48);
  ::std::
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ::~vector(&local_a8);
  return;
}

Assistant:

void Schedule() override {
		D_ASSERT(sink.hash_table->GetRadixBits() > JoinHashTable::INITIAL_RADIX_BITS);
		auto block_size = sink.hash_table->buffer_manager.GetBlockSize();

		idx_t total_size = 0;
		idx_t total_count = 0;
		for (auto &local_ht : local_hts) {
			auto &sink_collection = local_ht->GetSinkCollection();
			total_size += sink_collection.SizeInBytes();
			total_count += sink_collection.Count();
		}
		auto total_blocks = (total_size + block_size - 1) / block_size;
		auto count_per_block = total_count / total_blocks;
		auto blocks_per_vector = MaxValue<idx_t>(STANDARD_VECTOR_SIZE / count_per_block, 2);

		// Assume 8 blocks per partition per thread (4 input, 4 output)
		auto partition_multiplier =
		    RadixPartitioning::NumberOfPartitions(sink.hash_table->GetRadixBits() - JoinHashTable::INITIAL_RADIX_BITS);
		auto thread_memory = 2 * blocks_per_vector * partition_multiplier * block_size;
		auto repartition_threads = MaxValue<idx_t>(sink.temporary_memory_state->GetReservation() / thread_memory, 1);

		if (repartition_threads < local_hts.size()) {
			// Limit the number of threads working on repartitioning based on our memory reservation
			for (idx_t thread_idx = repartition_threads; thread_idx < local_hts.size(); thread_idx++) {
				local_hts[thread_idx % repartition_threads]->Merge(*local_hts[thread_idx]);
			}
			local_hts.resize(repartition_threads);
		}

		auto &context = pipeline->GetClientContext();

		vector<shared_ptr<Task>> partition_tasks;
		partition_tasks.reserve(local_hts.size());
		for (auto &local_ht : local_hts) {
			partition_tasks.push_back(
			    make_uniq<HashJoinRepartitionTask>(shared_from_this(), context, *sink.hash_table, *local_ht, op));
		}
		SetTasks(std::move(partition_tasks));
	}